

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

void __thiscall SQOuter::Finalize(SQOuter *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  
  pSVar3 = (this->_value).super_SQObject._unVal.pTable;
  SVar2 = (this->_value).super_SQObject._type;
  (this->_value).super_SQObject._type = OT_NULL;
  (this->_value).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

void Finalize() { _value.Null(); }